

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::
CmpHelperEQ<std::experimental::fundamentals_v1::optional<int>,std::experimental::fundamentals_v1::optional<int>>
          (char *expected_expression,char *actual_expression,optional<int> *expected,
          optional<int> *actual)

{
  bool bVar1;
  optional<int> *in_RCX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  undefined8 in_RDI;
  optional<int> *in_R8;
  AssertionResult AVar3;
  optional<int> *in_stack_00000030;
  optional<int> *in_stack_00000038;
  char *in_stack_00000040;
  char *in_stack_00000048;
  
  bVar1 = std::experimental::fundamentals_v1::operator==(in_RCX,in_R8);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    AVar3 = CmpHelperEQFailure<std::experimental::fundamentals_v1::optional<int>,std::experimental::fundamentals_v1::optional<int>>
                      (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
GTEST_DISABLE_MSC_WARNINGS_PUSH_(4389 /* signed/unsigned mismatch */)
  if (expected == actual) {
    return AssertionSuccess();
  }
GTEST_DISABLE_MSC_WARNINGS_POP_()

  return CmpHelperEQFailure(expected_expression, actual_expression, expected,
                            actual);
}